

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_All_Time.cpp
# Opt level: O3

bool __thiscall RenX_Ladder_All_TimePlugin::initialize(RenX_Ladder_All_TimePlugin *this)

{
  LadderDatabase *pLVar1;
  bool bVar2;
  undefined8 uVar3;
  const_iterator cVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  pLVar1 = &this->database;
  uVar3 = Jupiter::Config::get(&this->field_0x38,0xe,"LadderDatabase",9,"Ladder.db");
  Jupiter::Database::process_file(pLVar1,uVar3);
  uVar3 = Jupiter::Config::get(&this->field_0x38,0xc,"DatabaseName",8,"All-Time");
  RenX::LadderDatabase::setName(pLVar1,uVar3);
  local_28._M_len = 0xb;
  local_28._M_str = "OutputTimes";
  cVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->field_0x60,&local_28);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    in_string._M_str = extraout_RDX;
    in_string._M_len =
         *(size_t *)
          ((long)cVar4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                 ._M_cur + 0x28);
    Jupiter::asBool<char>
              (*(Jupiter **)
                ((long)cVar4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       ._M_cur + 0x30),in_string);
  }
  RenX::LadderDatabase::setOutputTimes(SUB81(pLVar1,0));
  local_28._M_len = 0xc;
  local_28._M_str = "ForceDefault";
  cVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->field_0x60,&local_28);
  if ((cVar4.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (in_string_00._M_str = extraout_RDX_00,
     in_string_00._M_len =
          *(size_t *)
           ((long)cVar4.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  ._M_cur + 0x28),
     bVar2 = Jupiter::asBool<char>
                       (*(Jupiter **)
                         ((long)cVar4.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                ._M_cur + 0x30),in_string_00), bVar2)) {
    RenX::default_ladder_database = pLVar1;
  }
  return true;
}

Assistant:

bool RenX_Ladder_All_TimePlugin::initialize() {
	// Load database
	this->database.process_file(this->config.get("LadderDatabase"sv, "Ladder.db"sv));
	this->database.setName(this->config.get("DatabaseName"sv, "All-Time"sv));
	this->database.setOutputTimes(this->config.get<bool>("OutputTimes"sv, true));

	// Force database to default, if desired
	if (this->config.get<bool>("ForceDefault"sv, true)) {
		RenX::default_ladder_database = &this->database;
	}

	return true;
}